

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O3

bool QFileSystemEngine::rmpath(QFileSystemEntry *entry)

{
  int iVar1;
  void *pvVar2;
  int *piVar3;
  undefined8 extraout_RDX;
  __off_t __length;
  __off_t extraout_RDX_00;
  bool bVar4;
  char *b;
  char *pcVar5;
  char *b_1;
  char *b_2;
  long in_FS_OFFSET;
  QString local_78;
  QString local_60;
  QByteArray local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::filePath(&local_78,entry);
  QDir::cleanPath(&local_60,&local_78);
  QString::toLocal8Bit_helper(&local_48,(QChar *)local_60.d.ptr,local_60.d.size);
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  pcVar5 = local_48.d.ptr;
  if (((undefined1 *)local_48.d.size == (undefined1 *)0x0) ||
     (pvVar2 = memchr(local_48.d.ptr,0,local_48.d.size),
     pvVar2 != (void *)0x0 && (long)pvVar2 - (long)pcVar5 != -1)) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
  }
  else {
    if (pcVar5 == (char *)0x0) {
      pcVar5 = "";
    }
    iVar1 = ::rmdir(pcVar5);
    pcVar5 = local_48.d.ptr;
    if (iVar1 == 0) {
      bVar4 = true;
      if (local_48.d.ptr != (char *)0x0) {
        pvVar2 = qmemrchr(local_48.d.ptr,0x2f,
                          (size_t)(local_48.d.size +
                                  (ulong)((undefined1 *)local_48.d.size == (undefined1 *)0x0)));
        pcVar5 = (char *)((long)pvVar2 - (long)pcVar5);
        __length = CONCAT71((int7)((ulong)extraout_RDX >> 8),
                            (long)pcVar5 < 1 || pvVar2 == (void *)0x0);
        if ((long)pcVar5 >= 1 && pvVar2 != (void *)0x0) {
          do {
            QByteArray::truncate(&local_48,pcVar5,__length);
            pcVar5 = local_48.d.ptr;
            if (local_48.d.ptr == (char *)0x0) {
              pcVar5 = "";
            }
            iVar1 = ::rmdir(pcVar5);
            pcVar5 = local_48.d.ptr;
          } while ((((iVar1 == 0) && (local_48.d.ptr != (char *)0x0)) &&
                   (pvVar2 = qmemrchr(local_48.d.ptr,0x2f,
                                      (size_t)(local_48.d.size +
                                              (ulong)((undefined1 *)local_48.d.size ==
                                                     (undefined1 *)0x0))), pvVar2 != (void *)0x0))
                  && (pcVar5 = (char *)((long)pvVar2 - (long)pcVar5), __length = extraout_RDX_00,
                     0 < (long)pcVar5));
        }
      }
      goto LAB_0012a589;
    }
  }
  bVar4 = false;
LAB_0012a589:
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QFileSystemEngine::rmpath(const QFileSystemEntry &entry)
{
    QByteArray path = QFile::encodeName(QDir::cleanPath(entry.filePath()));
    Q_CHECK_FILE_NAME(path, false);

    if (::rmdir(path.constData()) != 0)
        return false; // Only return false if `entry` couldn't be deleted

    const char sep = QDir::separator().toLatin1();
    qsizetype slash = path.lastIndexOf(sep);
    // `slash > 0` because truncate(0) would make `path` empty
    for (; slash > 0; slash = path.lastIndexOf(sep)) {
        path.truncate(slash);
        if (::rmdir(path.constData()) != 0)
            break;
    }

    return true;
}